

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

size_t __thiscall
booster::locale::impl_icu::date_format<wchar_t>::do_parse<int>
          (date_format<wchar_t> *this,string_type *str,int *value)

{
  int iVar1;
  size_t sVar2;
  double dVar3;
  ParsePosition pp;
  UnicodeString tmp;
  code *local_68;
  undefined8 local_60;
  double local_58;
  icu_std_converter<wchar_t,_4> local_50 [16];
  
  local_68 = std::_Rb_tree_increment;
  local_60 = 0xffffffff00000000;
  icu_std_converter<wchar_t,_4>::icu
            (local_50,(char_type_conflict *)&this->cvt_,(str->_M_dataplus)._M_p);
  dVar3 = (double)icu_70::DateFormat::parse
                            ((UnicodeString *)this->icu_fmt_,(ParsePosition *)local_50);
  if ((int)local_60 != 0) {
    dVar3 = dVar3 / 1000.0;
    sVar2 = 0;
    if ((2147483647.0 < dVar3) || (local_58 = dVar3, dVar3 < -2147483648.0)) goto LAB_00186287;
    iVar1 = icu_70::UnicodeString::countChar32((int)local_50,0);
    if (iVar1 != 0) {
      sVar2 = (size_t)iVar1;
      *value = (int)local_58;
      goto LAB_00186287;
    }
  }
  sVar2 = 0;
LAB_00186287:
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)local_50);
  icu_70::ParsePosition::~ParsePosition((ParsePosition *)&local_68);
  return sVar2;
}

Assistant:

size_t do_parse(string_type const &str,ValueType &value) const
            {
                icu::ParsePosition pp;
                icu::UnicodeString tmp = cvt_.icu(str.data(),str.data() + str.size());

                UDate udate = icu_fmt_->parse(tmp,pp);
                if(pp.getIndex() == 0)
                    return 0;
                double date = udate / 1000.0;
                typedef std::numeric_limits<ValueType> limits_type;
                if(date > limits_type::max() || date < limits_type::min())
                    return 0;
                size_t cut = cvt_.cut(tmp,str.data(),str.data()+str.size(),pp.getIndex());
                if(cut==0)
                    return 0;
                value=static_cast<ValueType>(date);
                return cut;

            }